

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

JsonParse * jsonParseFuncArg(sqlite3_context *ctx,sqlite3_value *pArg,u32 flgs)

{
  int iVar1;
  int iVar2;
  sqlite3 *psVar3;
  sqlite3 *pParse;
  sqlite3_vfs *psVar4;
  CollSeq *pCVar5;
  uint in_EDX;
  sqlite3_value *in_RSI;
  sqlite3 *in_RDI;
  char *zNew;
  int rc;
  int isRCStr;
  u32 nBlob;
  sqlite3 *db;
  JsonParse *pFromCache;
  JsonParse *p;
  int eType;
  JsonParse *in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa0;
  sqlite3 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  u32 uVar6;
  sqlite3_context *ctx_00;
  sqlite3 *local_30;
  sqlite3 *local_8;
  
  ctx_00 = (sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa;
  iVar1 = sqlite3_value_type(in_RSI);
  if (iVar1 == 5) {
    local_8 = (sqlite3 *)0x0;
  }
  else {
    local_8 = (sqlite3 *)
              jsonCacheSearch(ctx_00,(sqlite3_value *)
                                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if ((local_8 == (sqlite3 *)0x0) ||
       (*(u32 *)((long)&local_8->aDb + 4) = *(u32 *)((long)&local_8->aDb + 4) + 1, (in_EDX & 1) != 0
       )) {
      psVar3 = sqlite3_context_db_handle((sqlite3_context *)in_RDI);
      local_30 = local_8;
      while (pParse = (sqlite3 *)
                      sqlite3DbMallocZero(in_stack_ffffffffffffffa0,(u64)in_stack_ffffffffffffff98),
            pParse != (sqlite3 *)0x0) {
        memset(pParse,0,0x48);
        pParse->mutex = (sqlite3_mutex *)psVar3;
        *(u32 *)((long)&pParse->aDb + 4) = 1;
        if (local_30 != (sqlite3 *)0x0) {
          uVar6 = *(u32 *)&local_30->pVdbe;
          psVar4 = (sqlite3_vfs *)
                   sqlite3DbMallocRaw(in_stack_ffffffffffffffa8,(u64)in_stack_ffffffffffffffa0);
          pParse->pVfs = psVar4;
          if (pParse->pVfs != (sqlite3_vfs *)0x0) {
            memcpy(pParse->pVfs,local_30->pVfs,(ulong)uVar6);
            *(u32 *)&pParse->pVdbe = uVar6;
            *(u32 *)((long)&pParse->pVdbe + 4) = uVar6;
            *(u8 *)((long)&pParse->flags + 1) = *(u8 *)((long)&local_30->flags + 1);
            jsonParseFree((JsonParse *)0x23115c);
            return (JsonParse *)pParse;
          }
          break;
        }
        if ((iVar1 == 4) &&
           (iVar2 = jsonArgIsJsonb((sqlite3_value *)in_stack_ffffffffffffffa0,
                                   in_stack_ffffffffffffff98), iVar2 != 0)) {
          if ((in_EDX & 1) == 0) {
            return (JsonParse *)pParse;
          }
          iVar1 = jsonBlobMakeEditable
                            ((JsonParse *)in_stack_ffffffffffffffa8,
                             (u32)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
          if (iVar1 != 0) {
            return (JsonParse *)pParse;
          }
          break;
        }
        pCVar5 = (CollSeq *)sqlite3_value_text((sqlite3_value *)0x2311c3);
        pParse->pDfltColl = pCVar5;
        iVar2 = sqlite3_value_bytes((sqlite3_value *)0x2311d9);
        *(int *)&pParse->aDb = iVar2;
        if (psVar3->mallocFailed != '\0') break;
        if (*(int *)&pParse->aDb == 0) {
          if ((in_EDX & 2) != 0) {
            *(u8 *)((long)&pParse->mDbFlags + 2) = '\x01';
            return (JsonParse *)pParse;
          }
          jsonParseFree((JsonParse *)0x231392);
          sqlite3_result_error
                    ((sqlite3_context *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                     0);
          return (JsonParse *)0x0;
        }
        in_stack_ffffffffffffffa0 = in_RDI;
        if ((in_EDX & 2) != 0) {
          in_stack_ffffffffffffffa0 = (sqlite3 *)0x0;
        }
        in_stack_ffffffffffffffa8 = pParse;
        iVar2 = jsonConvertTextToBlob
                          ((JsonParse *)pParse,(sqlite3_context *)in_stack_ffffffffffffffa0);
        if (iVar2 != 0) {
          if ((in_EDX & 2) != 0) {
            *(u8 *)((long)&pParse->mDbFlags + 2) = '\x01';
            return (JsonParse *)pParse;
          }
          jsonParseFree((JsonParse *)0x23126e);
          return (JsonParse *)0x0;
        }
        iVar2 = sqlite3ValueIsOfClass(in_RSI,sqlite3RCStrUnref);
        if (iVar2 == 0) {
          pCVar5 = (CollSeq *)sqlite3RCStrNew((u64)in_stack_ffffffffffffff98);
          if (pCVar5 == (CollSeq *)0x0) break;
          memcpy(pCVar5,pParse->pDfltColl,(long)*(int *)&pParse->aDb);
          pParse->pDfltColl = pCVar5;
          *(char *)((long)&pParse->pDfltColl->zName + (long)*(int *)&pParse->aDb) = '\0';
        }
        else {
          sqlite3RCStrRef((char *)pParse->pDfltColl);
        }
        *(u8 *)&pParse->flags = '\x01';
        iVar2 = jsonCacheInsert((sqlite3_context *)in_stack_ffffffffffffffa8,
                                (JsonParse *)in_stack_ffffffffffffffa0);
        if (iVar2 == 7) break;
        local_30 = pParse;
        if ((in_EDX & 1) == 0) {
          return (JsonParse *)pParse;
        }
      }
      jsonParseFree((JsonParse *)0x2313bd);
      jsonParseFree((JsonParse *)0x2313c7);
      sqlite3_result_error_nomem((sqlite3_context *)0x2313d1);
      local_8 = (sqlite3 *)0x0;
    }
  }
  return (JsonParse *)local_8;
}

Assistant:

static JsonParse *jsonParseFuncArg(
  sqlite3_context *ctx,
  sqlite3_value *pArg,
  u32 flgs
){
  int eType;                   /* Datatype of pArg */
  JsonParse *p = 0;            /* Value to be returned */
  JsonParse *pFromCache = 0;   /* Value taken from cache */
  sqlite3 *db;                 /* The database connection */

  assert( ctx!=0 );
  eType = sqlite3_value_type(pArg);
  if( eType==SQLITE_NULL ){
    return 0;
  }
  pFromCache = jsonCacheSearch(ctx, pArg);
  if( pFromCache ){
    pFromCache->nJPRef++;
    if( (flgs & JSON_EDITABLE)==0 ){
      return pFromCache;
    }
  }
  db = sqlite3_context_db_handle(ctx);
rebuild_from_cache:
  p = sqlite3DbMallocZero(db, sizeof(*p));
  if( p==0 ) goto json_pfa_oom;
  memset(p, 0, sizeof(*p));
  p->db = db;
  p->nJPRef = 1;
  if( pFromCache!=0 ){
    u32 nBlob = pFromCache->nBlob;
    p->aBlob = sqlite3DbMallocRaw(db, nBlob);
    if( p->aBlob==0 ) goto json_pfa_oom;
    memcpy(p->aBlob, pFromCache->aBlob, nBlob);
    p->nBlobAlloc = p->nBlob = nBlob;
    p->hasNonstd = pFromCache->hasNonstd;
    jsonParseFree(pFromCache);
    return p;
  }
  if( eType==SQLITE_BLOB ){
    if( jsonArgIsJsonb(pArg,p) ){
      if( (flgs & JSON_EDITABLE)!=0 && jsonBlobMakeEditable(p, 0)==0 ){
        goto json_pfa_oom;
      }
      return p;
    }
    /* If the blob is not valid JSONB, fall through into trying to cast
    ** the blob into text which is then interpreted as JSON.  (tag-20240123-a)
    **
    ** This goes against all historical documentation about how the SQLite
    ** JSON functions were suppose to work.  From the beginning, blob was
    ** reserved for expansion and a blob value should have raised an error.
    ** But it did not, due to a bug.  And many applications came to depend
    ** upon this buggy behavior, espeically when using the CLI and reading
    ** JSON text using readfile(), which returns a blob.  For this reason
    ** we will continue to support the bug moving forward.
    ** See for example https://sqlite.org/forum/forumpost/012136abd5292b8d
    */
  }
  p->zJson = (char*)sqlite3_value_text(pArg);
  p->nJson = sqlite3_value_bytes(pArg);
  if( db->mallocFailed ) goto json_pfa_oom;
  if( p->nJson==0 ) goto json_pfa_malformed;
  assert( p->zJson!=0 );
  if( jsonConvertTextToBlob(p, (flgs & JSON_KEEPERROR) ? 0 : ctx) ){
    if( flgs & JSON_KEEPERROR ){
      p->nErr = 1;
      return p;
    }else{
      jsonParseFree(p);
      return 0;
    }
  }else{
    int isRCStr = sqlite3ValueIsOfClass(pArg, sqlite3RCStrUnref);
    int rc;
    if( !isRCStr ){
      char *zNew = sqlite3RCStrNew( p->nJson );
      if( zNew==0 ) goto json_pfa_oom;
      memcpy(zNew, p->zJson, p->nJson);
      p->zJson = zNew;
      p->zJson[p->nJson] = 0;
    }else{
      sqlite3RCStrRef(p->zJson);
    }
    p->bJsonIsRCStr = 1;
    rc = jsonCacheInsert(ctx, p);
    if( rc==SQLITE_NOMEM ) goto json_pfa_oom;
    if( flgs & JSON_EDITABLE ){
      pFromCache = p;
      p = 0;
      goto rebuild_from_cache;
    }
  }
  return p;

json_pfa_malformed:
  if( flgs & JSON_KEEPERROR ){
    p->nErr = 1;
    return p;
  }else{
    jsonParseFree(p);
    sqlite3_result_error(ctx, "malformed JSON", -1);
    return 0;
  }

json_pfa_oom:
  jsonParseFree(pFromCache);
  jsonParseFree(p);
  sqlite3_result_error_nomem(ctx);
  return 0;
}